

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::transform(btSoftBody *this,btTransform *trs)

{
  int iVar1;
  btCollisionShape *pbVar2;
  Node *pNVar3;
  btSoftBody *in_RSI;
  btSoftBody *in_RDI;
  btVector3 bVar4;
  Node *n;
  int ni;
  int i;
  btDbvtVolume vol;
  btScalar margin;
  btTransform *in_stack_ffffffffffffff58;
  btVector3 *in_stack_ffffffffffffff68;
  btDbvtVolume *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  btScalar in_stack_ffffffffffffff7c;
  btDbvt *in_stack_ffffffffffffff80;
  int local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  pbVar2 = btCollisionObject::getCollisionShape(&in_RDI->super_btCollisionObject);
  (*pbVar2->_vptr_btCollisionShape[0xc])();
  btDbvtAabbMm::btDbvtAabbMm((btDbvtAabbMm *)in_RDI);
  local_38 = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
  for (; local_38 < iVar1; local_38 = local_38 + 1) {
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_38);
    bVar4 = btTransform::operator*((btTransform *)in_RDI,(btVector3 *)in_stack_ffffffffffffff58);
    *(long *)(pNVar3->m_x).m_floats = bVar4.m_floats._0_8_;
    *(long *)((pNVar3->m_x).m_floats + 2) = bVar4.m_floats._8_8_;
    bVar4 = btTransform::operator*((btTransform *)in_RDI,(btVector3 *)in_stack_ffffffffffffff58);
    *(long *)(pNVar3->m_q).m_floats = bVar4.m_floats._0_8_;
    *(long *)((pNVar3->m_q).m_floats + 2) = bVar4.m_floats._8_8_;
    btTransform::getBasis((btTransform *)in_RSI);
    bVar4 = ::operator*((btMatrix3x3 *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    *(long *)(pNVar3->m_n).m_floats = bVar4.m_floats._0_8_;
    *(long *)((pNVar3->m_n).m_floats + 2) = bVar4.m_floats._8_8_;
    btDbvtAabbMm::FromCR((btVector3 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    in_stack_ffffffffffffffd0 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    in_stack_ffffffffffffffd4 = SUB84(in_stack_ffffffffffffff70,0);
    btDbvt::update(in_stack_ffffffffffffff80,
                   (btDbvtNode *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff70);
  }
  updateNormals((btSoftBody *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  updateBounds(in_RSI);
  updateConstants(in_RDI);
  btTransform::operator=((btTransform *)in_RDI,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void			btSoftBody::transform(const btTransform& trs)
{
	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x=trs*n.m_x;
		n.m_q=trs*n.m_q;
		n.m_n=trs.getBasis()*n.m_n;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
	m_initialWorldTransform = trs;
}